

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(double)>::PerformDefaultAction
          (FunctionMocker<std::error_code_(double)> *this,ArgumentTuple *args,
          string *call_description)

{
  bool bVar1;
  OnCallSpec<std::error_code_(double)> *this_00;
  Action<std::error_code_(double)> *this_01;
  runtime_error *this_02;
  Result RVar2;
  error_code eVar3;
  Result RVar4;
  undefined1 local_60 [8];
  string message;
  OnCallSpec<std::error_code_(double)> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<std::error_code_(double)> *this_local;
  error_category *local_10;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<std::error_code_(double)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<std::error_code>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_60);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    eVar3 = DefaultValue<std::error_code>::Get();
    local_10 = eVar3._M_cat;
    this_local._0_4_ = eVar3._M_value;
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    this_01 = OnCallSpec<std::error_code_(double)>::GetAction(this_00);
    std::tuple<double>::tuple((tuple<double> *)((long)&message.field_2 + 8),args);
    RVar2 = Action<std::error_code_(double)>::Perform
                      (this_01,(ArgumentTuple *)((long)&message.field_2 + 8));
    local_10 = RVar2._M_cat;
    this_local._0_4_ = RVar2._M_value;
  }
  RVar4._4_4_ = 0;
  RVar4._M_value = (uint)this_local;
  RVar4._M_cat = local_10;
  return RVar4;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }